

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void * phmap::container_internal::
       Allocate<8ul,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
                 (allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_> *alloc,
                 size_t n)

{
  M *pMVar1;
  A mem_alloc;
  new_allocator<M> local_1;
  
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x2b3,
                  "void *phmap::container_internal::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>]"
                 );
  }
  pMVar1 = __gnu_cxx::new_allocator<M>::allocate(&local_1,n + 7 >> 3,(void *)0x0);
  if (((ulong)pMVar1 & 7) == 0) {
    return pMVar1;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x2ba,
                "void *phmap::container_internal::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>]"
               );
}

Assistant:

void* Allocate(Alloc* alloc, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  void* p = AT::allocate(mem_alloc, (n + sizeof(M) - 1) / sizeof(M));
  assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
         "allocator does not respect alignment");
  return p;
}